

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O2

int egg_type_from_parent(int mnum,boolean force_ordinary)

{
  uint uVar1;
  
  if ((force_ordinary == '\0') && (uVar1 = mt_random(), uVar1 % 0x4d == 0)) {
    return mnum;
  }
  if (mnum == 6) {
    mnum = 1;
  }
  else if (mnum == 0x2b) {
    mnum = 0x2a;
  }
  return mnum;
}

Assistant:

int egg_type_from_parent(int mnum, /* parent monster; caller must handle lays_eggs() check */
			 boolean force_ordinary)
{
    if (force_ordinary || !BREEDER_EGG) {
	if (mnum == PM_QUEEN_BEE) mnum = PM_KILLER_BEE;
	else if (mnum == PM_WINGED_GARGOYLE) mnum = PM_GARGOYLE;
    }
    return mnum;
}